

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixmlparser.c
# Opt level: O1

ptrdiff_t Parser_getNextToken(Parser *xmlParser)

{
  byte *ss;
  int iVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long len;
  ptrdiff_t tlen;
  long local_20;
  
  ixml_membuf_destroy(&xmlParser->tokenBuf);
  if ((*xmlParser->curPtr != '\0') && (iVar1 = Parser_skipMisc(xmlParser), iVar1 == 0)) {
    ss = (byte *)xmlParser->curPtr;
    uVar2 = (ulong)*ss;
    if (0x3e < uVar2) {
LAB_001277ce:
      iVar1 = Parser_UTF8ToInt((char *)ss,&local_20);
      len = local_20;
      iVar4 = 0xce;
      iVar5 = 0;
      do {
        iVar3 = (iVar5 + iVar4) / 2;
        if (iVar1 < (int)(uint)Letter[iVar3].l) {
          iVar4 = iVar3 + -1;
        }
        else {
          if (iVar1 <= (int)(uint)Letter[iVar3].h) {
            iVar1 = Parser_UTF8ToInt(xmlParser->curPtr + local_20,&local_20);
            iVar1 = Parser_isNameChar(iVar1,1);
            if (iVar1 != 0) {
              do {
                len = len + local_20;
                iVar1 = Parser_UTF8ToInt(xmlParser->curPtr + len,&local_20);
                iVar1 = Parser_isNameChar(iVar1,1);
              } while (iVar1 != 0);
            }
            goto LAB_0012772b;
          }
          iVar5 = iVar3 + 1;
        }
        if (iVar4 < iVar5) {
          return 0;
        }
      } while( true );
    }
    if ((0x6000008400000000U >> (uVar2 & 0x3f) & 1) == 0) {
      if (uVar2 == 0x2f) {
        if (ss[1] == 0x3e) {
          xmlParser->savePtr = (char *)ss;
          len = 2;
        }
        else {
          len = 0;
        }
      }
      else {
        if (uVar2 != 0x3c) goto LAB_001277ce;
        iVar1 = Parser_UTF8ToInt((char *)(ss + 1),&local_20);
        len = 2;
        if (iVar1 != 0x2f) {
          iVar4 = 0xce;
          iVar5 = 0;
          do {
            iVar3 = (iVar5 + iVar4) / 2;
            if (iVar1 < (int)(uint)Letter[iVar3].l) {
              iVar4 = iVar3 + -1;
            }
            else {
              if (iVar1 <= (int)(uint)Letter[iVar3].h) goto LAB_00127725;
              iVar5 = iVar3 + 1;
            }
            if (iVar4 < iVar5) {
              return 0;
            }
          } while( true );
        }
      }
    }
    else {
LAB_00127725:
      len = 1;
    }
LAB_0012772b:
    iVar1 = Parser_copyToken(xmlParser,xmlParser->curPtr,len);
    if (iVar1 == 0) {
      xmlParser->curPtr = xmlParser->curPtr + len;
      return len;
    }
  }
  return 0;
}

Assistant:

static ptrdiff_t Parser_getNextToken(
	/*! [in] The XML parser. */
	Parser *xmlParser)
{
	ptrdiff_t tokenLength = 0;
	int temp;
	ptrdiff_t tlen;
	int rc;

	Parser_clearTokenBuf(xmlParser);

	if (*(xmlParser->curPtr) == '\0') {
		return 0;
	}
	/* skip XML instructions */
	rc = Parser_skipMisc(xmlParser);
	if (rc != IXML_SUCCESS) {
		return 0;
	}
	/* Attribute value logic must come first, since all text untokenized
	 * until end-quote */
	if (*(xmlParser->curPtr) == QUOTE) {
		tokenLength = 1;
	} else if (*(xmlParser->curPtr) == SINGLEQUOTE) {
		tokenLength = 1;
	} else if (*(xmlParser->curPtr) == LESSTHAN) {
		/* Check for start tags */
		temp = Parser_UTF8ToInt(xmlParser->curPtr + 1, &tlen);
		if (temp == '/') {
			/* token is '</' end tag */
			tokenLength = 2;
		} else if (Parser_isNameChar(temp, 0)) {
			/* '<' found, so return '<' token */
			tokenLength = 1;
		} else {
			/* error */
			return 0;
		}
	} else if (*(xmlParser->curPtr) == EQUALS) {
		/* Check for '=' token, return it as a token */
		tokenLength = 1;
	} else if (*(xmlParser->curPtr) == SLASH) {
		if (*(xmlParser->curPtr + 1) == GREATERTHAN) {
			/* token '/>' found */
			tokenLength = 2;
			/* fix */
			xmlParser->savePtr = xmlParser->curPtr;
		}
	} else if (*(xmlParser->curPtr) == GREATERTHAN) {
		/* > found, so return it as a token */
		tokenLength = 1;
	} else if (Parser_isNameChar(
			   Parser_UTF8ToInt(xmlParser->curPtr, &tlen), 0)) {
		/* Check for name tokens, name found, so find out how long it is
		 */
		ptrdiff_t iIndex = tlen;

		while (Parser_isNameChar(
			Parser_UTF8ToInt(xmlParser->curPtr + iIndex, &tlen),
			1)) {
			iIndex += tlen;
		}
		tokenLength = iIndex;
	} else {
		return 0;
	}

	/* Copy the token to the return string */
	if (Parser_copyToken(xmlParser, xmlParser->curPtr, tokenLength) !=
		IXML_SUCCESS) {
		return 0;
	}

	xmlParser->curPtr += tokenLength;
	return tokenLength;
}